

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VDotProdMulti_Serial(int nvec,N_Vector x,N_Vector *Y,realtype *dotprods)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  realtype rVar6;
  double dVar7;
  
  if (0 < nvec) {
    if (nvec == 1) {
      rVar6 = N_VDotProd_Serial(x,*Y);
      *dotprods = rVar6;
    }
    else {
      uVar1 = *x->content;
      lVar2 = *(long *)((long)x->content + 8);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar4 = 0; uVar4 != (uint)nvec; uVar4 = uVar4 + 1) {
        lVar3 = *(long *)((long)Y[uVar4]->content + 8);
        dotprods[uVar4] = 0.0;
        dVar7 = 0.0;
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          dVar7 = dVar7 + *(double *)(lVar2 + uVar5 * 8) * *(double *)(lVar3 + uVar5 * 8);
          dotprods[uVar4] = dVar7;
        }
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VDotProdMulti_Serial(int nvec, N_Vector x, N_Vector* Y, realtype* dotprods)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VDotProd */
  if (nvec == 1) {
    dotprods[0] = N_VDotProd_Serial(x, Y[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /* compute multiple dot products */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    dotprods[i] = ZERO;
    for (j=0; j<N; j++) {
      dotprods[i] += xd[j] * yd[j];
    }
  }

  return(0);
}